

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx::forward
          (BinaryOp_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  int _h;
  int _d;
  uint _c;
  uint _elempack;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  Option *pOVar6;
  Mat *pMVar7;
  Mat *a;
  Option *in_R8;
  Mat *pMVar8;
  Option *_elemsize;
  Option *pOVar9;
  Mat local_138;
  ulong local_f0;
  Mat local_e8;
  Mat local_98;
  Mat *local_48;
  Option *local_40;
  BinaryOp_x86_avx *local_38;
  
  pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = pMVar8[1].dims;
  if (pMVar8[1].dims < pMVar8->dims) {
    uVar5 = pMVar8->dims;
  }
  local_f0 = (ulong)uVar5;
  piVar1 = pMVar8->refcount;
  local_e8.data = pMVar8->data;
  local_e8.refcount._0_4_ = SUB84(pMVar8->refcount,0);
  local_e8.refcount._4_4_ = (undefined4)((ulong)pMVar8->refcount >> 0x20);
  local_e8.elemsize = pMVar8->elemsize;
  local_e8.elempack = pMVar8->elempack;
  local_e8.allocator = pMVar8->allocator;
  local_e8.dims = pMVar8->dims;
  local_e8.w = pMVar8->w;
  local_e8.h = pMVar8->h;
  local_e8.d = pMVar8->d;
  local_e8.c = pMVar8->c;
  local_e8.cstep = pMVar8->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  piVar1 = pMVar8[1].refcount;
  local_98.data = pMVar8[1].data;
  local_98.refcount._0_4_ = SUB84(pMVar8[1].refcount,0);
  local_98.refcount._4_4_ = (undefined4)((ulong)pMVar8[1].refcount >> 0x20);
  local_98.elemsize._0_4_ = (undefined4)pMVar8[1].elemsize;
  local_98.elemsize._4_4_ = (undefined4)(pMVar8[1].elemsize >> 0x20);
  local_98.elempack = pMVar8[1].elempack;
  local_98.allocator = pMVar8[1].allocator;
  local_98.dims = pMVar8[1].dims;
  local_98.w = pMVar8[1].w;
  local_98.h = pMVar8[1].h;
  local_98.d = pMVar8[1].d;
  local_98.c = pMVar8[1].c;
  local_98.cstep = pMVar8[1].cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  if (pMVar8->dims < (int)uVar5) {
    if (uVar5 == 2) {
      sVar4 = (long)pMVar8->elempack * (long)pMVar8->w;
      iVar3 = (int)sVar4;
      if (iVar3 == pMVar8[1].elempack * pMVar8[1].h) {
        in_R8 = (Option *)opt->workspace_allocator;
        Mat::reshape(&local_138,pMVar8,1,pMVar8->w,(Allocator *)in_R8);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_e8.data = local_138.data;
        local_e8.refcount._0_4_ = local_138.refcount._0_4_;
        local_e8.refcount._4_4_ = local_138.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_e8.elempack = local_138.elempack;
        local_e8.allocator = local_138.allocator;
        local_e8.dims = local_138.dims;
        local_e8.w = local_138.w;
        local_e8.h = local_138.h;
        local_e8.d = local_138.d;
        local_e8.c = local_138.c;
        local_e8.cstep = local_138.cstep;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                free(local_138.data);
              }
            }
            else {
              (*(local_138.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_e8.w = iVar3;
        local_e8.dims = 2;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar8->elemsize / (ulong)(long)pMVar8->elempack;
        local_e8.cstep = sVar4;
      }
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 3) && (pMVar8->dims == 1)) {
      sVar4 = (long)pMVar8->elempack * (long)pMVar8->w;
      iVar3 = (int)sVar4;
      if (iVar3 == pMVar8[1].elempack * pMVar8[1].c) {
        in_R8 = (Option *)(ulong)(uint)pMVar8->w;
        Mat::reshape(&local_138,pMVar8,1,1,pMVar8->w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_e8.data = local_138.data;
        local_e8.refcount._0_4_ = local_138.refcount._0_4_;
        local_e8.refcount._4_4_ = local_138.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_e8.elempack = local_138.elempack;
        local_e8.allocator = local_138.allocator;
        local_e8.dims = local_138.dims;
        local_e8.w = local_138.w;
        local_e8.h = local_138.h;
        local_e8.d = local_138.d;
        local_e8.c = local_138.c;
        local_e8.cstep = local_138.cstep;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                free(local_138.data);
              }
            }
            else {
              (*(local_138.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_e8.w = iVar3;
        local_e8.dims = 3;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar8->elemsize / (ulong)(long)pMVar8->elempack;
        local_e8.cstep = sVar4;
      }
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 3) && (pMVar8->dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar8->h;
      Mat::reshape(&local_138,pMVar8,1,pMVar8->w,pMVar8->h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_e8.data = local_138.data;
      local_e8.refcount._0_4_ = local_138.refcount._0_4_;
      local_e8.refcount._4_4_ = local_138.refcount._4_4_;
      local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_e8.elempack = local_138.elempack;
      local_e8.allocator = local_138.allocator;
      local_e8.dims = local_138.dims;
      local_e8.w = local_138.w;
      local_e8.h = local_138.h;
      local_e8.d = local_138.d;
      local_e8.c = local_138.c;
      local_e8.cstep = local_138.cstep;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 4) && (pMVar8->dims == 1)) {
      sVar4 = (long)pMVar8->elempack * (long)pMVar8->w;
      iVar3 = (int)sVar4;
      if (iVar3 == pMVar8[1].elempack * pMVar8[1].c) {
        in_R8 = (Option *)0x1;
        Mat::reshape(&local_138,pMVar8,1,1,1,pMVar8->w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (*(local_e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_e8.data = local_138.data;
        local_e8.refcount._0_4_ = local_138.refcount._0_4_;
        local_e8.refcount._4_4_ = local_138.refcount._4_4_;
        local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_e8.elempack = local_138.elempack;
        local_e8.allocator = local_138.allocator;
        local_e8.dims = local_138.dims;
        local_e8.w = local_138.w;
        local_e8.h = local_138.h;
        local_e8.d = local_138.d;
        local_e8.c = local_138.c;
        local_e8.cstep = local_138.cstep;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                free(local_138.data);
              }
            }
            else {
              (*(local_138.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_e8.w = iVar3;
        local_e8.dims = 4;
        local_e8.elempack = 1;
        local_e8.elemsize = pMVar8->elemsize / (ulong)(long)pMVar8->elempack;
        local_e8.cstep = sVar4;
      }
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 4) && (pMVar8->dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar8->w;
      Mat::reshape(&local_138,pMVar8,1,1,pMVar8->w,pMVar8->h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_e8.data = local_138.data;
      local_e8.refcount._0_4_ = local_138.refcount._0_4_;
      local_e8.refcount._4_4_ = local_138.refcount._4_4_;
      local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_e8.elempack = local_138.elempack;
      local_e8.allocator = local_138.allocator;
      local_e8.dims = local_138.dims;
      local_e8.w = local_138.w;
      local_e8.h = local_138.h;
      local_e8.d = local_138.d;
      local_e8.c = local_138.c;
      local_e8.cstep = local_138.cstep;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 4) && (pMVar8->dims == 3)) {
      in_R8 = (Option *)(ulong)(uint)pMVar8->h;
      Mat::reshape(&local_138,pMVar8,1,pMVar8->w,pMVar8->h,pMVar8->c,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_e8.data = local_138.data;
      local_e8.refcount._0_4_ = local_138.refcount._0_4_;
      local_e8.refcount._4_4_ = local_138.refcount._4_4_;
      local_e8.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_e8.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_e8.elempack = local_138.elempack;
      local_e8.allocator = local_138.allocator;
      local_e8.dims = local_138.dims;
      local_e8.w = local_138.w;
      local_e8.h = local_138.h;
      local_e8.d = local_138.d;
      local_e8.c = local_138.c;
      local_e8.cstep = local_138.cstep;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar5 = (uint)local_f0;
    }
  }
  local_48 = (Mat *)top_blobs;
  if (pMVar8[1].dims < (int)uVar5) {
    pMVar7 = pMVar8 + 1;
    if (uVar5 == 2) {
      sVar4 = (long)pMVar8[1].elempack * (long)pMVar8[1].w;
      iVar3 = (int)sVar4;
      if (iVar3 == pMVar8->elempack * pMVar8->h) {
        in_R8 = (Option *)opt->workspace_allocator;
        Mat::reshape(&local_138,pMVar7,1,pMVar8[1].w,(Allocator *)in_R8);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_98.data = local_138.data;
        local_98.refcount._0_4_ = local_138.refcount._0_4_;
        local_98.refcount._4_4_ = local_138.refcount._4_4_;
        local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_98.elempack = local_138.elempack;
        local_98.allocator = local_138.allocator;
        local_98.dims = local_138.dims;
        local_98.w = local_138.w;
        local_98.h = local_138.h;
        local_98.d = local_138.d;
        local_98.c = local_138.c;
        local_98.cstep = local_138.cstep;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                free(local_138.data);
              }
            }
            else {
              (*(local_138.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_98.w = iVar3;
        local_98.dims = 2;
        local_98.elempack = 1;
        local_98.elemsize = pMVar8[1].elemsize / (ulong)(long)pMVar8[1].elempack;
        local_98.cstep = sVar4;
      }
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 3) && (pMVar8[1].dims == 1)) {
      in_R8 = (Option *)(long)pMVar8[1].w;
      sVar4 = (long)pMVar8[1].elempack * (long)in_R8;
      iVar3 = (int)sVar4;
      if (iVar3 == pMVar8->elempack * pMVar8->c) {
        Mat::reshape(&local_138,pMVar7,1,1,pMVar8[1].w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_98.data = local_138.data;
        local_98.refcount._0_4_ = local_138.refcount._0_4_;
        local_98.refcount._4_4_ = local_138.refcount._4_4_;
        local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_98.elempack = local_138.elempack;
        local_98.allocator = local_138.allocator;
        local_98.dims = local_138.dims;
        local_98.w = local_138.w;
        local_98.h = local_138.h;
        local_98.d = local_138.d;
        local_98.c = local_138.c;
        local_98.cstep = local_138.cstep;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                free(local_138.data);
              }
            }
            else {
              (*(local_138.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_98.w = iVar3;
        local_98.dims = 3;
        local_98.elempack = 1;
        local_98.elemsize = pMVar8[1].elemsize / (ulong)(long)pMVar8[1].elempack;
        local_98.cstep = sVar4;
      }
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 3) && (pMVar8[1].dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar8[1].h;
      Mat::reshape(&local_138,pMVar7,1,pMVar8[1].w,pMVar8[1].h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_98.data = local_138.data;
      local_98.refcount._0_4_ = local_138.refcount._0_4_;
      local_98.refcount._4_4_ = local_138.refcount._4_4_;
      local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_98.elempack = local_138.elempack;
      local_98.allocator = local_138.allocator;
      local_98.dims = local_138.dims;
      local_98.w = local_138.w;
      local_98.h = local_138.h;
      local_98.d = local_138.d;
      local_98.c = local_138.c;
      local_98.cstep = local_138.cstep;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 4) && (pMVar8[1].dims == 1)) {
      sVar4 = (long)pMVar8[1].elempack * (long)pMVar8[1].w;
      iVar3 = (int)sVar4;
      if (iVar3 == pMVar8->elempack * pMVar8->c) {
        in_R8 = (Option *)0x1;
        Mat::reshape(&local_138,pMVar7,1,1,1,pMVar8[1].w,opt->workspace_allocator);
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
        local_98.data = local_138.data;
        local_98.refcount._0_4_ = local_138.refcount._0_4_;
        local_98.refcount._4_4_ = local_138.refcount._4_4_;
        local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
        local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
        local_98.elempack = local_138.elempack;
        local_98.allocator = local_138.allocator;
        local_98.dims = local_138.dims;
        local_98.w = local_138.w;
        local_98.h = local_138.h;
        local_98.d = local_138.d;
        local_98.c = local_138.c;
        local_98.cstep = local_138.cstep;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_138.allocator == (Allocator *)0x0) {
              if (local_138.data != (void *)0x0) {
                free(local_138.data);
              }
            }
            else {
              (*(local_138.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_138.cstep = 0;
        local_138.data = (void *)0x0;
        local_138.refcount._0_4_ = 0;
        local_138.refcount._4_4_ = 0;
        local_138.elemsize._0_4_ = 0;
        local_138.elemsize._4_4_ = 0;
        local_138.elempack = 0;
        local_138.dims = 0;
        local_138.w = 0;
        local_138.h = 0;
        local_138.d = 0;
        local_138.c = 0;
      }
      else {
        local_98.w = iVar3;
        local_98.dims = 4;
        local_98.elempack = 1;
        local_98.elemsize = pMVar8[1].elemsize / (ulong)(long)pMVar8[1].elempack;
        local_98.cstep = sVar4;
      }
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 4) && (pMVar8[1].dims == 2)) {
      in_R8 = (Option *)(ulong)(uint)pMVar8[1].w;
      Mat::reshape(&local_138,pMVar7,1,1,pMVar8[1].w,pMVar8[1].h,opt->workspace_allocator);
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_98.data = local_138.data;
      local_98.refcount._0_4_ = local_138.refcount._0_4_;
      local_98.refcount._4_4_ = local_138.refcount._4_4_;
      local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_98.elempack = local_138.elempack;
      local_98.allocator = local_138.allocator;
      local_98.dims = local_138.dims;
      local_98.w = local_138.w;
      local_98.h = local_138.h;
      local_98.d = local_138.d;
      local_98.c = local_138.c;
      local_98.cstep = local_138.cstep;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar5 = (uint)local_f0;
    }
    if ((uVar5 == 4) && (pMVar8[1].dims == 3)) {
      in_R8 = (Option *)(ulong)(uint)pMVar8[1].h;
      Mat::reshape(&local_138,pMVar7,1,pMVar8[1].w,pMVar8[1].h,pMVar8[1].c,opt->workspace_allocator)
      ;
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      local_98.data = local_138.data;
      local_98.refcount._0_4_ = local_138.refcount._0_4_;
      local_98.refcount._4_4_ = local_138.refcount._4_4_;
      local_98.elemsize._0_4_ = (undefined4)local_138.elemsize;
      local_98.elemsize._4_4_ = local_138.elemsize._4_4_;
      local_98.elempack = local_138.elempack;
      local_98.allocator = local_138.allocator;
      local_98.dims = local_138.dims;
      local_98.w = local_138.w;
      local_98.h = local_138.h;
      local_98.d = local_138.d;
      local_98.c = local_138.c;
      local_98.cstep = local_138.cstep;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if (local_138.data != (void *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_138.cstep = 0;
      local_138.data = (void *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      uVar5 = (uint)local_f0;
    }
  }
  iVar3 = local_98.w;
  if (local_98.w < local_e8.w) {
    iVar3 = local_e8.w;
  }
  _h = local_98.h;
  if (local_98.h < local_e8.h) {
    _h = local_e8.h;
  }
  _d = local_98.d;
  if (local_98.d < local_e8.d) {
    _d = local_e8.d;
  }
  _c = local_98.c;
  if (local_98.c < local_e8.c) {
    _c = local_e8.c;
  }
  pOVar6 = (Option *)(ulong)_c;
  _elemsize = (Option *)local_98.elemsize;
  if (local_98.elemsize < local_e8.elemsize) {
    _elemsize = (Option *)local_e8.elemsize;
  }
  _elempack = local_98.elempack;
  if (local_98.elempack < local_e8.elempack) {
    _elempack = local_e8.elempack;
  }
  pOVar9 = (Option *)(ulong)_elempack;
  pMVar8 = (Mat *)local_48->data;
  local_40 = opt;
  local_38 = this;
  switch(uVar5) {
  case 1:
    in_R8 = (Option *)opt->blob_allocator;
    local_48 = pMVar8;
    Mat::create(pMVar8,iVar3,(size_t)_elemsize,_elempack,(Allocator *)in_R8);
    iVar2 = (int)local_f0;
    pMVar8 = local_48;
    if (iVar2 == 4) goto switchD_003e6a5a_caseD_4;
    if (iVar2 == 3) goto switchD_003e6a5a_caseD_3;
    if (iVar2 == 2) goto switchD_003e6a5a_caseD_2;
    break;
  case 2:
switchD_003e6a5a_caseD_2:
    local_48 = pMVar8;
    Mat::create(local_48,iVar3,_h,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    pMVar8 = local_48;
    if ((int)local_f0 == 4) goto switchD_003e6a5a_caseD_4;
    in_R8 = pOVar9;
    if ((int)local_f0 == 3) goto switchD_003e6a5a_caseD_3;
    break;
  case 3:
switchD_003e6a5a_caseD_3:
    local_48 = pMVar8;
    in_R8 = _elemsize;
    Mat::create(local_48,iVar3,_h,_c,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    pMVar8 = local_48;
    if ((int)local_f0 == 4) goto switchD_003e6a5a_caseD_4;
    break;
  case 4:
switchD_003e6a5a_caseD_4:
    local_48 = pMVar8;
    Mat::create(local_48,iVar3,_h,_d,_c,(size_t)_elemsize,_elempack,local_40->blob_allocator);
    in_R8 = pOVar6;
    pMVar8 = local_48;
  }
  iVar3 = -100;
  if ((pMVar8->data == (void *)0x0) || ((long)pMVar8->c * pMVar8->cstep == 0)) goto LAB_003e6c27;
  if (local_e8.elempack < local_98.elempack) {
LAB_003e6bba:
    iVar3 = (local_38->super_BinaryOp).op_type;
    uVar5 = iVar3 - 1;
    if ((uVar5 < 0xb) && ((0x7e5U >> (uVar5 & 0x1f) & 1) != 0)) {
      iVar3 = *(int *)(&DAT_005f923c + (ulong)uVar5 * 4);
    }
    a = &local_98;
    pMVar7 = &local_e8;
  }
  else {
    if (local_e8.elempack == local_98.elempack) {
      if (local_e8.elempack * local_e8.w * local_e8.h * local_e8.d * local_e8.c <
          local_98.elempack * local_98.w * local_98.h * local_98.d * local_98.c) goto LAB_003e6bba;
    }
    iVar3 = (local_38->super_BinaryOp).op_type;
    a = &local_e8;
    pMVar7 = &local_98;
  }
  binary_op_broadcast(a,pMVar7,pMVar8,iVar3,in_R8);
  iVar3 = 0;
LAB_003e6c27:
  piVar1 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  piVar1 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar3;
}

Assistant:

int BinaryOp_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w * A.elempack == B.h * B.elempack)
                A2 = A.reshape(1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 2;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 3;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 4;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c, opt.workspace_allocator);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w * B.elempack == A.h * A.elempack)
                B2 = B.reshape(1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 2;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 3;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 4;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c, opt.workspace_allocator);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);
    const size_t out_elemsize = std::max(A2.elemsize, B2.elemsize);
    const int out_elempack = std::max(A2.elempack, B2.elempack);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    const bool a_pack_is_lower = A2.elempack < B2.elempack;
    const bool a_pack_is_equal = A2.elempack == B2.elempack;
    const bool a_size_is_lower = A2.w * A2.h * A2.d * A2.c * A2.elempack < B2.w * B2.h * B2.d * B2.c * B2.elempack;
    if (a_pack_is_lower || (a_pack_is_equal && a_size_is_lower))
    {
        binary_op_broadcast(B2, A2, top_blob, get_reverse_op_type(op_type), opt);
    }
    else
    {
        binary_op_broadcast(A2, B2, top_blob, op_type, opt);
    }

    return 0;
}